

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_test.cpp
# Opt level: O0

int __thiscall test_app::upperA::convert(upperA *this,char *begin,char *end,streambuf *out)

{
  int iVar1;
  char in_CL;
  long in_RDX;
  long in_RSI;
  char c;
  long local_18;
  
  local_18 = in_RSI;
  do {
    if (local_18 == in_RDX) {
      return 0;
    }
    local_18 = local_18 + 1;
    iVar1 = std::streambuf::sputc(in_CL);
  } while (iVar1 != -1);
  return -1;
}

Assistant:

int convert(char const *begin,char const *end,std::streambuf *out)
		{
			while(begin!=end) {
				char c=*begin++;
				if('a'<=c && c<='z')
					c = 'A' + (c-'a');
				if(out->sputc(c)==EOF)
					return -1;
			}
			return 0;
		}